

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O1

void __thiscall miniros::NodeHandle::construct(NodeHandle *this,string *ns,bool validate_name)

{
  bool bVar1;
  int iVar2;
  NodeHandleBackingCollection *__s;
  TopicManagerPtr *pTVar3;
  ServiceManagerPtr *pSVar4;
  string local_70;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = isInitialized();
  if (!bVar1) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (construct::loc.initialized_ == false) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,"miniros.unknown_package","");
      console::initializeLogLocation(&construct::loc,&local_70,Fatal);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    if (construct::loc.level_ != Fatal) {
      construct();
    }
    if (construct::loc.logger_enabled_ == true) {
      construct();
    }
  }
  __s = (NodeHandleBackingCollection *)operator_new(0xa8);
  pTVar3 = TopicManager::instance();
  local_50 = (pTVar3->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48._M_pi =
       (pTVar3->super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
    }
  }
  pSVar4 = ServiceManager::instance();
  local_40 = (pSVar4->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  local_38._M_pi =
       (pSVar4->super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
       ._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  memset(__s,0,0xa8);
  (__s->keep_alive_topic_manager).
  super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_50;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__s->keep_alive_topic_manager).
              super___shared_ptr<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_48);
  (__s->keep_alive_service_manager).
  super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__s->keep_alive_service_manager).
              super___shared_ptr<miniros::ServiceManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  this->collection_ = __s;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  std::__cxx11::string::_M_assign((string *)&this->unresolved_namespace_);
  if (validate_name) {
    resolveName(&local_70,this,ns,true);
  }
  else {
    resolveName();
  }
  std::__cxx11::string::operator=((string *)this,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  this->ok_ = true;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)g_nh_refcount_mutex);
  if (iVar2 == 0) {
    if (g_nh_refcount == 0) {
      bVar1 = isStarted();
      if (!bVar1) {
        g_node_started_by_nh = 1;
        miniros::start();
      }
    }
    g_nh_refcount = g_nh_refcount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)g_nh_refcount_mutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void NodeHandle::construct(const std::string& ns, bool validate_name)
{
  if (!miniros::isInitialized())
  {
    MINIROS_FATAL("You must call miniros::init() before creating the first NodeHandle");
    MINIROS_BREAK();
  }

  collection_ = new NodeHandleBackingCollection(getTopicManager(), getServiceManager());
  unresolved_namespace_ = ns;
  // if callback_queue_ is nonnull, we are in a non-nullary constructor

  if (validate_name)
    namespace_ = resolveName(ns, true);
  else
    {
      namespace_ = resolveName(ns, true, no_validate());
      // FIXME validate namespace_ now
    }
  ok_ = true;

  std::scoped_lock<std::mutex> lock(g_nh_refcount_mutex);

  if (g_nh_refcount == 0 && !miniros::isStarted())
  {
    g_node_started_by_nh = true;
    miniros::start();
  }

  ++g_nh_refcount;
}